

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void save_load_regularizer(vw *all,bfgs *b,io_buf *model_file,bool read,bool text)

{
  float fVar1;
  size_t sVar2;
  byte bVar3;
  size_t sVar4;
  float *pfVar5;
  ostream *poVar6;
  byte in_CL;
  byte bVar7;
  size_t in_RDX;
  char *in_RSI;
  io_buf *in_RDI;
  byte in_R8B;
  stringstream msg;
  weight *v;
  size_t brw;
  uint32_t i;
  uint32_t length;
  int c;
  undefined6 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  bool bVar8;
  vw *in_stack_fffffffffffffe10;
  stringstream local_1c0 [16];
  undefined1 local_1b0 [111];
  undefined1 in_stack_fffffffffffffebf;
  stringstream *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  io_buf *in_stack_fffffffffffffed8;
  size_t local_30;
  uint local_28;
  int iVar9;
  undefined2 in_stack_ffffffffffffffe4;
  
  bVar7 = in_CL & 1;
  bVar3 = in_R8B & 1;
  iVar9 = 0;
  sVar2 = in_RDI->count;
  local_28 = 0;
  if (((in_RSI[0xb8] & 1U) != 0) && (bVar7 == 0)) {
    preconditioner_to_regularizer
              (in_stack_fffffffffffffe10,
               (bfgs *)CONCAT17(in_stack_fffffffffffffe0f,
                                CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)),0.0);
  }
  do {
    local_30 = 1;
    if ((bVar7 & 1) == 0) {
      pfVar5 = (float *)(*(long *)(in_RSI + 0xd8) + (ulong)local_28 * 4);
      fVar1 = *pfVar5;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        iVar9 = iVar9 + 1;
        std::__cxx11::stringstream::stringstream(local_1c0);
        std::ostream::operator<<(local_1b0,local_28);
        local_30 = bin_text_write_fixed
                             (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                              in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                              (bool)in_stack_fffffffffffffebf);
        poVar6 = std::operator<<((ostream *)local_1b0,":");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pfVar5);
        std::operator<<(poVar6,"\n");
        in_stack_fffffffffffffe10 =
             (vw *)bin_text_write_fixed
                             (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                              in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                              (bool)in_stack_fffffffffffffebf);
        local_30 = (long)&in_stack_fffffffffffffe10->sd + local_30;
        std::__cxx11::stringstream::~stringstream(local_1c0);
      }
    }
    else {
      iVar9 = iVar9 + 1;
      local_30 = io_buf::bin_read_fixed
                           (in_RDI,in_RSI,in_RDX,
                            (char *)CONCAT17(bVar7,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffffe4
                                                                           ,iVar9))));
      if (local_30 != 0) {
        sVar4 = io_buf::bin_read_fixed
                          (in_RDI,in_RSI,in_RDX,
                           (char *)CONCAT17(bVar7,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffffe4,
                                                                          iVar9))));
        local_30 = sVar4 + local_30;
      }
    }
    if ((bVar7 & 1) == 0) {
      local_28 = local_28 + 1;
    }
    if (((bVar7 & 1) != 0) ||
       (bVar8 = true, (uint)((1 << ((byte)(int)sVar2 & 0x1f)) << 1) <= local_28)) {
      in_stack_fffffffffffffe0e = (bVar7 & 1) != 0 && local_30 != 0;
      bVar8 = (bool)in_stack_fffffffffffffe0e;
    }
  } while (bVar8);
  if ((bVar7 & 1) != 0) {
    regularizer_to_weight
              (in_stack_fffffffffffffe10,
               (bfgs *)(ulong)CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08));
  }
  return;
}

Assistant:

void save_load_regularizer(vw& all, bfgs& b, io_buf& model_file, bool read, bool text)
{
  int c = 0;
  uint32_t length = 2 * (1 << all.num_bits);
  uint32_t i = 0;
  size_t brw = 1;

  if (b.output_regularizer && !read)
    preconditioner_to_regularizer(*(b.all), b, b.all->l2_lambda);

  do
  {
    brw = 1;
    weight* v;
    if (read)
    {
      c++;
      brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        assert(i < length);
        v = &(b.regularizers[i]);
        brw += model_file.bin_read_fixed((char*)v, sizeof(*v), "");
      }
    }
    else  // write binary or text
    {
      v = &(b.regularizers[i]);
      if (*v != 0.)
      {
        c++;
        stringstream msg;
        msg << i;
        brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        msg << ":" << *v << "\n";
        brw += bin_text_write_fixed(model_file, (char*)v, sizeof(*v), msg, text);
      }
    }
    if (!read)
      i++;
  } while ((!read && i < length) || (read && brw > 0));

  if (read)
    regularizer_to_weight(all, b);
}